

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,SocketError error)

{
  long lVar1;
  Stream *pSVar2;
  long *plVar3;
  QDebug *pQVar4;
  int in_EDX;
  undefined4 in_register_00000034;
  QDebug *this;
  char *t;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  this = (QDebug *)CONCAT44(in_register_00000034,error);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,this);
  plVar3 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar3 + 0x30) = 0;
  switch(in_EDX) {
  case 0:
    t = "QAbstractSocket::ConnectionRefusedError";
    break;
  case 1:
    t = "QAbstractSocket::RemoteHostClosedError";
    break;
  case 2:
    t = "QAbstractSocket::HostNotFoundError";
    break;
  case 3:
    t = "QAbstractSocket::SocketAccessError";
    break;
  case 4:
    t = "QAbstractSocket::SocketResourceError";
    break;
  case 5:
    t = "QAbstractSocket::SocketTimeoutError";
    break;
  case 6:
    t = "QAbstractSocket::DatagramTooLargeError";
    break;
  case 7:
    t = "QAbstractSocket::NetworkError";
    break;
  case 8:
    t = "QAbstractSocket::AddressInUseError";
    break;
  case 9:
    t = "QAbstractSocket::SocketAddressNotAvailableError";
    break;
  case 10:
    t = "QAbstractSocket::UnsupportedSocketOperationError";
    break;
  case 0xb:
    t = "QAbstractSocket::UnfinishedSocketOperationError";
    break;
  case 0xc:
    t = "QAbstractSocket::ProxyAuthenticationRequiredError";
    break;
  default:
    pQVar4 = QDebug::operator<<(this,"QAbstractSocket::SocketError(");
    pQVar4 = QDebug::operator<<(pQVar4,in_EDX);
    QDebug::operator<<(pQVar4,')');
    goto LAB_001b5282;
  case 0xe:
    t = "QAbstractSocket::ProxyConnectionRefusedError";
    break;
  case 0xf:
    t = "QAbstractSocket::ProxyConnectionClosedError";
    break;
  case 0x10:
    t = "QAbstractSocket::ProxyConnectionTimeoutError";
    break;
  case 0x11:
    t = "QAbstractSocket::ProxyNotFoundError";
    break;
  case 0x12:
    t = "QAbstractSocket::ProxyProtocolError";
    break;
  case -1:
    t = "QAbstractSocket::UnknownSocketError";
  }
  QDebug::operator<<(this,t);
LAB_001b5282:
  pSVar2 = this->stream;
  this->stream = (Stream *)0x0;
  *(Stream **)debug.stream = pSVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

Q_NETWORK_EXPORT QDebug operator<<(QDebug debug, QAbstractSocket::SocketError error)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    switch (error) {
    case QAbstractSocket::ConnectionRefusedError:
        debug << "QAbstractSocket::ConnectionRefusedError";
        break;
    case QAbstractSocket::RemoteHostClosedError:
        debug << "QAbstractSocket::RemoteHostClosedError";
        break;
    case QAbstractSocket::HostNotFoundError:
        debug << "QAbstractSocket::HostNotFoundError";
        break;
    case QAbstractSocket::SocketAccessError:
        debug << "QAbstractSocket::SocketAccessError";
        break;
    case QAbstractSocket::SocketResourceError:
        debug << "QAbstractSocket::SocketResourceError";
        break;
    case QAbstractSocket::SocketTimeoutError:
        debug << "QAbstractSocket::SocketTimeoutError";
        break;
    case QAbstractSocket::DatagramTooLargeError:
        debug << "QAbstractSocket::DatagramTooLargeError";
        break;
    case QAbstractSocket::NetworkError:
        debug << "QAbstractSocket::NetworkError";
        break;
    case QAbstractSocket::AddressInUseError:
        debug << "QAbstractSocket::AddressInUseError";
        break;
    case QAbstractSocket::SocketAddressNotAvailableError:
        debug << "QAbstractSocket::SocketAddressNotAvailableError";
        break;
    case QAbstractSocket::UnsupportedSocketOperationError:
        debug << "QAbstractSocket::UnsupportedSocketOperationError";
        break;
    case QAbstractSocket::UnfinishedSocketOperationError:
        debug << "QAbstractSocket::UnfinishedSocketOperationError";
        break;
    case QAbstractSocket::ProxyAuthenticationRequiredError:
        debug << "QAbstractSocket::ProxyAuthenticationRequiredError";
        break;
    case QAbstractSocket::UnknownSocketError:
        debug << "QAbstractSocket::UnknownSocketError";
        break;
    case QAbstractSocket::ProxyConnectionRefusedError:
        debug << "QAbstractSocket::ProxyConnectionRefusedError";
        break;
    case QAbstractSocket::ProxyConnectionClosedError:
        debug << "QAbstractSocket::ProxyConnectionClosedError";
        break;
    case QAbstractSocket::ProxyConnectionTimeoutError:
        debug << "QAbstractSocket::ProxyConnectionTimeoutError";
        break;
    case QAbstractSocket::ProxyNotFoundError:
        debug << "QAbstractSocket::ProxyNotFoundError";
        break;
    case QAbstractSocket::ProxyProtocolError:
        debug << "QAbstractSocket::ProxyProtocolError";
        break;
    default:
        debug << "QAbstractSocket::SocketError(" << int(error) << ')';
        break;
    }
    return debug;
}